

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O2

string * __thiscall CLI::App::_compare_subcommand_names_abi_cxx11_(App *this,App *subcom,App *base)

{
  pointer psVar1;
  string *psVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  pointer psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *les;
  App *pAVar8;
  pointer pbVar9;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::estring_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)
                                   ::estring_abi_cxx11_), iVar5 != 0)) {
    _compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::estring_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::
                   estring_abi_cxx11_.field_2;
    _compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::estring_abi_cxx11_.
    _M_string_length = 0;
    _compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::estring_abi_cxx11_.
    field_2._M_local_buf[0] = '\0';
    __cxa_atexit(::std::__cxx11::string::~string,
                 &_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::
                  estring_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::
                         estring_abi_cxx11_);
  }
  if (subcom->disabled_ == false) {
    psVar1 = (base->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar7 = (base->subcommands_).
                  super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1; psVar7 = psVar7 + 1)
    {
      pAVar8 = (psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((pAVar8 != subcom) && (pAVar8->disabled_ == false)) {
        if ((subcom->name_)._M_string_length != 0) {
          ::std::__cxx11::string::string((string *)&local_b0,(string *)&subcom->name_);
          bVar4 = check_name(pAVar8,&local_b0);
          ::std::__cxx11::string::~string((string *)&local_b0);
          if (bVar4) {
            return &subcom->name_;
          }
          pAVar8 = (psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        }
        if ((pAVar8->name_)._M_string_length != 0) {
          ::std::__cxx11::string::string((string *)&local_50,(string *)&pAVar8->name_);
          bVar4 = check_name(subcom,&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
          if (bVar4) {
            return &((psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    name_;
          }
        }
        psVar2 = (subcom->aliases_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (psVar6 = (subcom->aliases_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pAVar8 = (psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
            psVar6 != psVar2; psVar6 = psVar6 + 1) {
          ::std::__cxx11::string::string((string *)&local_70,(string *)psVar6);
          bVar4 = check_name(pAVar8,&local_70);
          ::std::__cxx11::string::~string((string *)&local_70);
          if (bVar4) {
            return psVar6;
          }
        }
        pbVar3 = (pAVar8->aliases_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar9 = (pAVar8->aliases_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar3;
            pbVar9 = pbVar9 + 1) {
          ::std::__cxx11::string::string((string *)&local_90,(string *)pbVar9);
          bVar4 = check_name(subcom,&local_90);
          ::std::__cxx11::string::~string((string *)&local_90);
          if (bVar4) {
            return pbVar9;
          }
        }
        pAVar8 = (psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (((pAVar8->name_)._M_string_length == 0) &&
           (psVar6 = _compare_subcommand_names_abi_cxx11_(this,subcom,pAVar8),
           psVar6->_M_string_length != 0)) {
          return psVar6;
        }
        if (((subcom->name_)._M_string_length == 0) &&
           (psVar6 = _compare_subcommand_names_abi_cxx11_
                               (this,(psVar7->
                                     super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr,subcom), psVar6->_M_string_length != 0)) {
          return psVar6;
        }
      }
    }
  }
  return &_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::estring_abi_cxx11_;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE const std::string &App::_compare_subcommand_names(const App &subcom,
                                                                               const App &base) const {
    static const std::string estring;
    if(subcom.disabled_) {
        return estring;
    }
    for(const auto &subc : base.subcommands_) {
        if(subc.get() != &subcom) {
            if(subc->disabled_) {
                continue;
            }
            if(!subcom.get_name().empty()) {
                if(subc->check_name(subcom.get_name())) {
                    return subcom.get_name();
                }
            }
            if(!subc->get_name().empty()) {
                if(subcom.check_name(subc->get_name())) {
                    return subc->get_name();
                }
            }
            for(const auto &les : subcom.aliases_) {
                if(subc->check_name(les)) {
                    return les;
                }
            }
            // this loop is needed in case of ignore_underscore or ignore_case on one but not the other
            for(const auto &les : subc->aliases_) {
                if(subcom.check_name(les)) {
                    return les;
                }
            }
            // if the subcommand is an option group we need to check deeper
            if(subc->get_name().empty()) {
                const auto &cmpres = _compare_subcommand_names(subcom, *subc);
                if(!cmpres.empty()) {
                    return cmpres;
                }
            }
            // if the test subcommand is an option group we need to check deeper
            if(subcom.get_name().empty()) {
                const auto &cmpres = _compare_subcommand_names(*subc, subcom);
                if(!cmpres.empty()) {
                    return cmpres;
                }
            }
        }
    }
    return estring;
}